

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnIf(TypeChecker *this,TypeVector *param_types,TypeVector *result_types)

{
  Result rhs;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  Result result;
  
  this_local._4_4_ = PopAndCheck1Type(this,I32,"if");
  rhs = PopAndCheckSignature(this,param_types,"if");
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  PushLabel(this,If,param_types,result_types);
  PushTypes(this,param_types);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnIf(const TypeVector& param_types,
                         const TypeVector& result_types) {
  Result result = PopAndCheck1Type(Type::I32, "if");
  result |= PopAndCheckSignature(param_types, "if");
  PushLabel(LabelType::If, param_types, result_types);
  PushTypes(param_types);
  return result;
}